

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O2

testing_base testing_new(int argc,char **argv,int flags)

{
  char cVar1;
  char *pcVar2;
  FILE *__stream;
  int iVar3;
  uint uVar4;
  testing_base ptVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  
  ptVar5 = (testing_base)calloc(1,0x78);
  ptVar5->flags = flags;
  __stream = _stderr;
  ptVar5->fp = (FILE *)_stderr;
  ptVar5->argc = argc;
  ptVar5->argv = argv;
  uVar7 = 1;
  ptVar5->parallelism = 1;
  ptVar5->run_tests = 1;
  ptVar5->is_uniprocessor = -1;
  pcVar2 = *argv;
  pcVar8 = pcVar2;
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    pcVar6 = strrchr(pcVar8,(int)"/\\"[lVar10]);
    if (pcVar6 != (char *)0x0) {
      pcVar8 = pcVar6 + 1;
    }
  }
  ptVar5->prog = pcVar8;
  iVar9 = 0;
LAB_00105422:
  uVar4 = argc;
  if ((uVar7 == argc) || (pcVar8 = argv[(int)uVar7], uVar4 = uVar7, *pcVar8 != '-')) {
    uVar7 = uVar4;
    uVar4 = 0;
  }
  else {
    pcVar6 = pcVar8;
    if ((pcVar8[1] != '-') || (pcVar8[2] != '\0')) {
LAB_00105454:
      pcVar6 = pcVar6 + 1;
      cVar1 = *pcVar6;
      switch(cVar1) {
      case 'h':
        ptVar5->suppress_header = 1;
        goto LAB_00105454;
      case 'i':
      case 'j':
      case 'k':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 't':
      case 'u':
      case 'w':
        goto switchD_00105467_caseD_69;
      case 'l':
        iVar9 = iVar9 + 1;
        goto LAB_001054db;
      case 'm':
        uVar7 = uVar7 + 1;
        if (uVar7 != argc) {
          ptVar5->include_pat = argv[(int)uVar7];
          goto LAB_00105454;
        }
        pcVar8 = "%s: -m flag expects ,- or |-separated strings\n";
        break;
      case 'n':
        uVar7 = uVar7 + 1;
        if ((uVar7 != argc) && (iVar3 = atoi(argv[(int)uVar7]), 0 < iVar3)) {
          ptVar5->parallelism = iVar3;
          goto LAB_00105454;
        }
        pcVar8 = "%s: -n flag expects parallelism value >= 1\n";
        break;
      case 's':
        iVar9 = iVar9 + -1;
LAB_001054db:
        ptVar5->longshort = iVar9;
        goto LAB_00105454;
      case 'v':
        ptVar5->verbose = 1;
        goto LAB_00105454;
      case 'x':
        uVar7 = uVar7 + 1;
        if (uVar7 != argc) {
          ptVar5->exclude_pat = argv[(int)uVar7];
          goto LAB_00105454;
        }
        pcVar8 = "%s: -x flag expects ,- or |-separated strings\n";
        break;
      default:
        goto switchD_00105467_default;
      }
      fprintf(__stream,pcVar8,pcVar2);
      goto LAB_001055c7;
    }
    uVar4 = 0;
    if (pcVar8[1] == '-') {
      uVar4 = (uint)(pcVar8[2] == '\0');
    }
  }
  ptVar5->argn = uVar7 + uVar4;
  return ptVar5;
switchD_00105467_default:
  if (cVar1 == 'B') goto LAB_00105503;
  if (cVar1 == 'b') {
    ptVar5->run_benchmarks = 1;
    goto LAB_00105454;
  }
  if (cVar1 != '\0') {
    if (cVar1 == 'H') {
      output_header(_stdout,"");
      exit(0);
    }
switchD_00105467_caseD_69:
    fprintf(__stream,"%s: unrecognized flag \'%c\' in arg %d: \"%s\"\n",pcVar2,
            (ulong)(uint)(int)cVar1,(ulong)uVar7,pcVar8);
LAB_001055c7:
    exit(2);
  }
  uVar7 = uVar7 + 1;
  goto LAB_00105422;
LAB_00105503:
  ptVar5->run_tests = 0;
  ptVar5->run_benchmarks = 1;
  goto LAB_00105454;
}

Assistant:

testing_base testing_new (int argc, char *argv[], int flags) {
	static const char sep[] = { '/', '\\' };
	int i;
	int argn;
	testing_base tb = (testing_base)malloc (sizeof (*tb));
	memset ((void *) tb, 0, sizeof (*tb));
	tb->flags = flags;
	tb->fp = stderr;
	tb->argc = argc;
	tb->argv = argv;
	tb->parallelism = 1;
	tb->run_tests = 1;
	tb->is_uniprocessor = -1;
	tb->prog = tb->argv[0];
	for (i = 0; i != sizeof (sep) / sizeof (sep[0]); i++) {
		char *last = strrchr (tb->prog, sep[i]);
		if (last != NULL) {
			tb->prog = last + 1;
		}
	}
	for (argn = 1; argn != argc && argv[argn][0] == '-' &&
		       strcmp (argv[argn], "--") != 0; argn++) {
		const char *arg = argv[argn];
		const char *f;
		for (f = &arg[1]; *f != 0; f++) {
			process_flag (tb, &argn, argc, argv, *f, arg);
		}
	}
	tb->argn = argn + (argn != argc && strcmp (argv[argn], "--") == 0);
	return (tb);
}